

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xarray.c
# Opt level: O2

void xarray_free(xarray_t *array)

{
  if (array != (xarray_t *)0x0) {
    xarray_clear(array);
    free(array);
    return;
  }
  return;
}

Assistant:

void xarray_free(xarray_t* array)
{
    if (array)
    {
        xarray_clear(array);
#if XARRAY_ENABLE_CACHE
        xarray_node_cache_free(array);
        xarray_block_cache_free(array);
#endif
        free(array);
    }
}